

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Abc_NtkRecLibMerge3(Gia_Man_t *pLib)

{
  Gia_Man_t *p_00;
  Lms_Man_t *pLVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  Vec_Str_t *p_01;
  Gia_Obj_t *pGVar8;
  word *t;
  abctime aVar9;
  abctime aVar10;
  bool bVar11;
  abctime clk2;
  abctime clk;
  Gia_Obj_t *pTemp;
  Gia_Obj_t *pDriver;
  Gia_Obj_t *pObjPo;
  int nLeaves;
  int iFanin1;
  int iFanin0;
  int Index;
  int k;
  int i;
  word *pTruth;
  char local_48 [4];
  uint uCanonPhase;
  char pCanonPerm [16];
  Vec_Str_t *vSupps;
  Gia_Man_t *pGia;
  Lms_Man_t *p;
  int fCheck;
  Gia_Man_t *pLib_local;
  
  pLVar1 = s_pMan3;
  p_00 = s_pMan3->pGia;
  clk = 0;
  aVar7 = Abc_Clock();
  iVar3 = Gia_ManCiNum(pLib);
  iVar4 = Gia_ManCiNum(p_00);
  if (iVar3 == iVar4) {
    iVar3 = Gia_ManCiNum(pLib);
    iVar4 = Gia_ManCiNum(p_00);
    if (iVar3 != iVar4) {
      __assert_fail("Gia_ManCiNum(pLib) == Gia_ManCiNum(pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x249,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
    }
    iVar3 = Vec_IntSize(&p_00->vHTable);
    if (iVar3 == 0) {
      Gia_ManHashStart(p_00);
    }
    p_01 = Lms_GiaSuppSizes(pLib);
    iFanin0 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(pLib->vCos);
      bVar11 = false;
      if (iFanin0 < iVar3) {
        pDriver = Gia_ManCo(pLib,iFanin0);
        bVar11 = pDriver != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      bVar2 = Vec_StrEntry(p_01,iFanin0);
      iVar3 = (int)(char)bVar2;
      if (iVar3 < 2) {
        __assert_fail("nLeaves > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x255,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
      }
      aVar10 = Abc_Clock();
      pGVar8 = Gia_ObjFanin0(pDriver);
      t = Gia_ObjComputeTruthTable(pLib,pGVar8);
      aVar9 = Abc_Clock();
      pLVar1->timeTruth = (aVar9 - aVar10) + pLVar1->timeTruth;
      aVar10 = Abc_Clock();
      memcpy(pLVar1->pTemp1,t,(long)pLVar1->nWords << 3);
      uVar5 = Abc_TtCanonicize(pLVar1->pTemp1,iVar3,local_48);
      Abc_TtStretch5((uint *)pLVar1->pTemp1,iVar3,pLVar1->nVars);
      aVar9 = Abc_Clock();
      pLVar1->timeCanon = (aVar9 - aVar10) + pLVar1->timeCanon;
      if ((iVar3 != 2) || (iVar4 = Abc_TtSupportSize(t,2), iVar4 == 2)) {
        aVar10 = Abc_Clock();
        for (Index = 0; Index < iVar3; Index = Index + 1) {
          pGVar8 = Gia_ManPi(p_00,Index);
          iVar4 = Gia_ObjId(p_00,pGVar8);
          uVar6 = Abc_Var2Lit(iVar4,uVar5 >> ((byte)Index & 0x1f) & 1);
          pGVar8 = Gia_ManCi(pLib,(int)local_48[Index]);
          pGVar8->Value = uVar6;
        }
        iVar3 = Vec_IntSize(pLib->vTtNodes);
        if (iVar3 < 1) {
          __assert_fail("Vec_IntSize(pLib->vTtNodes) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x26e,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
        }
        Index = 0;
        while( true ) {
          iVar3 = Vec_IntSize(pLib->vTtNodes);
          bVar11 = false;
          if (Index < iVar3) {
            iVar3 = Vec_IntEntry(pLib->vTtNodes,Index);
            clk = (abctime)Gia_ManObj(pLib,iVar3);
            bVar11 = (Gia_Obj_t *)clk != (Gia_Obj_t *)0x0;
          }
          if (!bVar11) break;
          pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)clk);
          uVar6 = pGVar8->Value;
          iVar3 = Gia_ObjFaninC0((Gia_Obj_t *)clk);
          iVar3 = Abc_LitNotCond(uVar6,iVar3);
          pGVar8 = Gia_ObjFanin1((Gia_Obj_t *)clk);
          uVar6 = pGVar8->Value;
          iVar4 = Gia_ObjFaninC1((Gia_Obj_t *)clk);
          iVar4 = Abc_LitNotCond(uVar6,iVar4);
          iVar3 = Gia_ManHashAnd(p_00,iVar3,iVar4);
          *(int *)(clk + 8) = iVar3;
          Index = Index + 1;
        }
        aVar9 = Abc_Clock();
        pLVar1->timeBuild = (aVar9 - aVar10) + pLVar1->timeBuild;
        iVar3 = Gia_ObjIsAnd((Gia_Obj_t *)clk);
        if (iVar3 == 0) {
          __assert_fail("Gia_ObjIsAnd(pTemp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x278,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
        }
        iVar3 = Abc_Lit2Var(*(int *)(clk + 8));
        pGVar8 = Gia_ManObj(p_00,iVar3);
        if ((*(ulong *)pGVar8 >> 0x3e & 1) == 0) {
          *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xbfffffffffffffff | 0x4000000000000000;
          iVar3 = Abc_LitNotCond(*(int *)(clk + 8),uVar5 >> (bVar2 & 0x1f) & 1);
          Gia_ManAppendCo(p_00,iVar3);
          aVar10 = Abc_Clock();
          iVar3 = Vec_MemHashInsert(pLVar1->vTtMem,pLVar1->pTemp1);
          Vec_IntPush(pLVar1->vTruthIds,iVar3);
          iVar3 = Gia_ManCoNum(p_00);
          iVar4 = Vec_IntSize(pLVar1->vTruthIds);
          if (iVar3 != iVar4) {
            __assert_fail("Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x29f,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
          }
          pLVar1->nAdded = pLVar1->nAdded + 1;
          aVar9 = Abc_Clock();
          pLVar1->timeInsert = (aVar9 - aVar10) + pLVar1->timeInsert;
        }
        else {
          pLVar1->nFilterSame = pLVar1->nFilterSame + 1;
        }
      }
      iFanin0 = iFanin0 + 1;
    }
    Vec_StrFree(p_01);
    aVar10 = Abc_Clock();
    pLVar1->timeTotal = (aVar10 - aVar7) + pLVar1->timeTotal;
  }
  else {
    uVar5 = Gia_ManCiNum(pLib);
    uVar6 = Gia_ManCiNum(p_00);
    printf("The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n",
           (ulong)uVar5,(ulong)uVar6);
  }
  return;
}

Assistant:

void Abc_NtkRecLibMerge3( Gia_Man_t * pLib )
{
    int fCheck = 0;
    Lms_Man_t * p = s_pMan3;
    Gia_Man_t * pGia = p->pGia;
    Vec_Str_t * vSupps;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    word * pTruth;
    int i, k, Index, iFanin0, iFanin1, nLeaves;
    Gia_Obj_t * pObjPo, * pDriver, * pTemp = NULL;
    abctime clk, clk2 = Abc_Clock();

    if ( Gia_ManCiNum(pLib) != Gia_ManCiNum(pGia) )
    {
        printf( "The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n", Gia_ManCiNum(pLib), Gia_ManCiNum(pGia) );
        return;
    }
    assert( Gia_ManCiNum(pLib) == Gia_ManCiNum(pGia) );

    // create hash table if not available
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
        Gia_ManHashStart( pGia );

    // add AIG subgraphs
    vSupps = Lms_GiaSuppSizes( pLib );
    Gia_ManForEachCo( pLib, pObjPo, k )
    {
        // get support size
        nLeaves = Vec_StrEntry(vSupps, k);
        assert( nLeaves > 1 );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Gia_ObjComputeTruthTable( pLib, Gia_ObjFanin0(pObjPo) );
p->timeTruth += Abc_Clock() - clk;
        // semi-canonicize
clk = Abc_Clock();
        memcpy( p->pTemp1, pTruth, p->nWords * sizeof(word) );
#ifdef LMS_USE_OLD_FORM
        uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pTemp1, (unsigned *)p->pTemp2, nLeaves, pCanonPerm );
#else
        uCanonPhase = Abc_TtCanonicize( p->pTemp1, nLeaves, pCanonPerm );
#endif
        Abc_TtStretch5( (unsigned *)p->pTemp1, nLeaves, p->nVars );
p->timeCanon += Abc_Clock() - clk;
        // pCanonPerm and uCanonPhase show what was the variable corresponding to each var in the current truth
        if ( nLeaves == 2 && Abc_TtSupportSize(pTruth, 2) != 2 )
            continue;

clk = Abc_Clock();
        // map cut leaves into elementary variables of GIA
        for ( i = 0; i < nLeaves; i++ )
            Gia_ManCi( pLib, pCanonPerm[i] )->Value = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManPi(pGia, i)), (uCanonPhase >> i) & 1 );
        // build internal nodes
        assert( Vec_IntSize(pLib->vTtNodes) > 0 );
        Gia_ManForEachObjVec( pLib->vTtNodes, pLib, pTemp, i )
        {
            iFanin0 = Abc_LitNotCond( Gia_ObjFanin0(pTemp)->Value, Gia_ObjFaninC0(pTemp) );
            iFanin1 = Abc_LitNotCond( Gia_ObjFanin1(pTemp)->Value, Gia_ObjFaninC1(pTemp) );
            pTemp->Value = Gia_ManHashAnd( pGia, iFanin0, iFanin1 );
        }
p->timeBuild += Abc_Clock() - clk;

        // check if this node is already driving a PO
        assert( Gia_ObjIsAnd(pTemp) );
        pDriver = Gia_ManObj(pGia, Abc_Lit2Var(pTemp->Value));
        if ( pDriver->fMark1 )
        {
            p->nFilterSame++;
            continue;
        }
        pDriver->fMark1 = 1;
        // create output
        Gia_ManAppendCo( pGia, Abc_LitNotCond( pTemp->Value, (uCanonPhase >> nLeaves) & 1 ) );

        // verify truth table
        if ( fCheck )
        {
clk = Abc_Clock();
        pTemp = Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1);
        pTruth = Gia_ObjComputeTruthTable( pGia, Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1) );
p->timeCheck += Abc_Clock() - clk;
        if ( memcmp( p->pTemp1, pTruth, p->nWords * sizeof(word) ) != 0 )
        {
    
            Kit_DsdPrintFromTruth( (unsigned *)pTruth, nLeaves ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned *)p->pTemp1, nLeaves ); printf( "\n" );
            printf( "Truth table verification has failed.\n" );
    
            // drive PO with constant
            Gia_ManPatchCoDriver( pGia, Gia_ManCoNum(pGia)-1, 0 );
            // save truth table ID
            Vec_IntPush( p->vTruthIds, -1 );
            p->nFilterTruth++;
            continue;
        }
        }

clk = Abc_Clock();
        // add the resulting truth table to the hash table 
        Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
        // save truth table ID
        Vec_IntPush( p->vTruthIds, Index );
        assert( Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds) );
        p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
    }
    Vec_StrFree( vSupps );
p->timeTotal += Abc_Clock() - clk2;
}